

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_output_find_unknown
              (wally_psbt_output *parent,uchar *key,size_t key_len,size_t *written)

{
  size_t *written_local;
  size_t key_len_local;
  uchar *key_local;
  wally_psbt_output *parent_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (parent == (wally_psbt_output *)0x0) {
    parent_local._4_4_ = -2;
  }
  else {
    parent_local._4_4_ = wally_map_find(&parent->unknowns,key,key_len,written);
  }
  return parent_local._4_4_;
}

Assistant:

int wally_psbt_output_set_blinding_pubkey(struct wally_psbt_output *output,
                                          const unsigned char *pub_key,
                                          size_t pub_key_len)
{
    int ret;
    if (!output || BYTES_INVALID(pub_key, pub_key_len))
        return WALLY_EINVAL;
    if (pub_key &&
        (ret = wally_ec_public_key_verify(pub_key, pub_key_len)) != WALLY_OK)
        return ret;
    return replace_bytes(pub_key, pub_key_len,
                         &output->blinding_pubkey, &output->blinding_pubkey_len);
}